

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize.h
# Opt level: O2

void __thiscall
cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::DepGraph
          (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *this,
          Cluster<bitset_detail::IntBitSet<unsigned_int>_> *cluster)

{
  uint uVar1;
  pointer pEVar2;
  uint uVar3;
  ulong uVar4;
  pointer ppVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  allocator_type local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ::vector(&this->entries,
           ((long)(cluster->
                  super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(cluster->
                 super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start) / 0x18,&local_21);
  ppVar5 = (cluster->
           super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (uVar3 = 0; uVar4 = (ulong)uVar3,
      uVar4 < (ulong)(((long)(cluster->
                             super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5) / 0x18);
      uVar3 = uVar3 + 1) {
    pEVar2 = (this->entries).
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pEVar2[uVar4].feerate.size = ppVar5[uVar4].first.size;
    pEVar2[uVar4].feerate.fee = ppVar5[uVar4].first.fee;
    ppVar5 = (cluster->
             super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    (this->entries).
    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar4].ancestors.m_val =
         ppVar5[uVar4].second.m_val | 1 << (uVar3 & 0x1f);
  }
  pEVar2 = (this->entries).
           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->entries).
                 super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2) / 0x18;
  for (uVar3 = 0; uVar3 < uVar4; uVar3 = uVar3 + 1) {
    uVar8 = pEVar2[uVar3].ancestors.m_val;
    for (uVar7 = 0; uVar6 = (ulong)uVar7, uVar6 < uVar4; uVar7 = uVar7 + 1) {
      uVar1 = pEVar2[uVar6].ancestors.m_val;
      if ((uVar1 & 1 << ((byte)uVar3 & 0x1f)) != 0) {
        pEVar2[uVar6].ancestors.m_val = uVar1 | uVar8;
      }
    }
  }
  for (uVar3 = 0; uVar3 < uVar4; uVar3 = uVar3 + 1) {
    uVar8 = pEVar2[uVar3].ancestors.m_val;
    uVar7 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
      }
    }
    if (uVar8 == 0) {
      uVar7 = 0;
    }
    uVar6 = (ulong)uVar7;
    while (uVar8 != 0) {
      pEVar2[uVar6].descendants.m_val = pEVar2[uVar6].descendants.m_val | 1 << ((byte)uVar3 & 0x1f);
      uVar8 = uVar8 - 1 & uVar8;
      uVar7 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      if (uVar8 != 0) {
        uVar6 = (ulong)uVar7;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

explicit DepGraph(const Cluster<SetType>& cluster) noexcept : entries(cluster.size())
    {
        for (ClusterIndex i = 0; i < cluster.size(); ++i) {
            // Fill in fee and size.
            entries[i].feerate = cluster[i].first;
            // Fill in direct parents as ancestors.
            entries[i].ancestors = cluster[i].second;
            // Make sure transactions are ancestors of themselves.
            entries[i].ancestors.Set(i);
        }

        // Propagate ancestor information.
        for (ClusterIndex i = 0; i < entries.size(); ++i) {
            // At this point, entries[a].ancestors[b] is true iff b is an ancestor of a and there
            // is a path from a to b through the subgraph consisting of {a, b} union
            // {0, 1, ..., (i-1)}.
            SetType to_merge = entries[i].ancestors;
            for (ClusterIndex j = 0; j < entries.size(); ++j) {
                if (entries[j].ancestors[i]) {
                    entries[j].ancestors |= to_merge;
                }
            }
        }

        // Fill in descendant information by transposing the ancestor information.
        for (ClusterIndex i = 0; i < entries.size(); ++i) {
            for (auto j : entries[i].ancestors) {
                entries[j].descendants.Set(i);
            }
        }
    }